

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phf.cc
# Opt level: O2

int PHF::init<phf_string,true>(phf *phf,phf_string *k,size_t n,size_t l,size_t a,phf_seed_t seed)

{
  undefined8 *puVar1;
  long *plVar2;
  ulong *puVar3;
  undefined8 *puVar4;
  ulong uVar5;
  byte bVar6;
  undefined8 uVar7;
  uint32_t uVar8;
  uint uVar9;
  uint32_t uVar10;
  size_t __nmemb;
  size_t sVar11;
  phf_string *__base;
  int *piVar12;
  uint32_t *puVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  phf_string *ppVar17;
  phf_string *ppVar18;
  phf_string *ppVar19;
  ulong uVar20;
  size_t sVar21;
  ulong uVar22;
  phf_string *ppVar23;
  ulong uVar24;
  long lVar25;
  bool bVar26;
  phf_string k_00;
  void *local_50;
  void *local_40;
  
  uVar24 = n + (n == 0);
  uVar14 = l + (l == 0);
  sVar11 = 100;
  if (a < 100) {
    sVar11 = a;
  }
  phf->nodiv = true;
  if (uVar24 <= uVar14) {
    uVar14 = uVar24;
  }
  __nmemb = phf_powerup(uVar24 / uVar14);
  sVar11 = phf_powerup((uVar24 * 100) / (sVar11 + (sVar11 == 0)));
  if (sVar11 == 0 || __nmemb == 0) {
    iVar16 = 0x22;
  }
  else {
    __base = (phf_string *)calloc(uVar24,0x20);
    if ((__base == (phf_string *)0x0) || (local_50 = calloc(__nmemb,8), local_50 == (void *)0x0)) {
      local_40 = (void *)0x0;
      local_50 = (void *)0x0;
    }
    else {
      lVar25 = 0;
      sVar21 = n;
      while (bVar26 = sVar21 != 0, sVar21 = sVar21 - 1, bVar26) {
        k_00.n = *(size_t *)((long)&k->n + lVar25);
        k_00.p = *(void **)((long)&k->p + lVar25);
        uVar8 = phf_g<phf_string>(k_00,seed);
        uVar9 = uVar8 & (int)__nmemb - 1U;
        puVar4 = (undefined8 *)((long)&k->p + lVar25);
        uVar7 = puVar4[1];
        puVar1 = (undefined8 *)((long)&__base->p + lVar25 * 2);
        *puVar1 = *puVar4;
        puVar1[1] = uVar7;
        *(uint *)((long)&__base[1].p + lVar25 * 2) = uVar9;
        *(void **)((long)&__base[1].n + lVar25 * 2) = (void *)((long)local_50 + (ulong)uVar9 * 8);
        plVar2 = (long *)((long)local_50 + (ulong)uVar9 * 8);
        *plVar2 = *plVar2 + 1;
        lVar25 = lVar25 + 0x10;
      }
      qsort(__base,uVar24,0x20,phf_keycmp<phf_string>);
      uVar14 = sVar11 + 0x3f >> 6;
      local_40 = calloc(uVar14 * 2,8);
      if (local_40 == (void *)0x0) {
        local_40 = (void *)0x0;
      }
      else {
        puVar13 = (uint32_t *)calloc(__nmemb,4);
        if (puVar13 != (uint32_t *)0x0) {
          uVar24 = 0;
          ppVar17 = __base;
LAB_00127f38:
          uVar24 = uVar24 & 0xffffffff;
          if ((ppVar17 < __base + n * 2) && (*(long *)ppVar17[1].n != 0)) {
            ppVar23 = ppVar17 + *(long *)ppVar17[1].n * 2;
            uVar22 = 0;
            do {
              uVar22 = uVar22 + 1;
              ppVar18 = ppVar17;
              while( true ) {
                uVar8 = (uint32_t)uVar22;
                ppVar19 = ppVar17;
                if (ppVar23 <= ppVar18) goto LAB_00127ff8;
                uVar10 = phf_f_mod_m<true,phf_string>(uVar8,*ppVar18,seed,sVar11);
                uVar15 = (ulong)(uVar10 >> 6);
                uVar20 = 1L << ((byte)uVar10 & 0x3f);
                if (((*(ulong *)((long)local_40 + uVar15 * 8) >> ((ulong)uVar10 & 0x3f) & 1) != 0)
                   || (uVar5 = *(ulong *)((long)local_40 + uVar15 * 8 + uVar14 * 8),
                      (uVar5 & uVar20) != 0)) break;
                *(ulong *)((long)local_40 + uVar15 * 8 + uVar14 * 8) = uVar5 | uVar20;
                ppVar18 = ppVar18 + 2;
              }
              for (; ppVar19 < ppVar23; ppVar19 = ppVar19 + 2) {
                uVar10 = phf_f_mod_m<true,phf_string>(uVar8,*ppVar19,seed,sVar11);
                bVar6 = (byte)uVar10 & 0x3f;
                puVar3 = (ulong *)((long)local_40 + (ulong)(uVar10 >> 6) * 8 + uVar14 * 8);
                *puVar3 = *puVar3 & (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6);
              }
            } while( true );
          }
          phf->seed = seed;
          phf->r = __nmemb;
          phf->m = sVar11;
          phf->g = puVar13;
          phf->d_max = uVar24;
          phf->g_op = PHF_G_UINT32_BAND_R;
          phf->g_jmp = (void *)0x0;
          iVar16 = 0;
          goto LAB_00127e98;
        }
      }
    }
    piVar12 = __errno_location();
    iVar16 = *piVar12;
LAB_00127e98:
    free(local_40);
    free(local_50);
    free(__base);
  }
  return iVar16;
LAB_00127ff8:
  for (; ppVar19 < ppVar23; ppVar19 = ppVar19 + 2) {
    uVar10 = phf_f_mod_m<true,phf_string>(uVar8,*ppVar19,seed,sVar11);
    puVar3 = (ulong *)((long)local_40 + (ulong)(uVar10 >> 6) * 8);
    *puVar3 = *puVar3 | 1L << ((byte)uVar10 & 0x3f);
  }
  puVar13[*(uint *)&ppVar17[1].p] = uVar8;
  ppVar17 = ppVar23;
  if (uVar24 < uVar22) {
    uVar24 = uVar22;
  }
  goto LAB_00127f38;
}

Assistant:

PHF_PUBLIC int PHF::init(struct phf *phf, const key_t k[], const size_t n, const size_t l, const size_t a, const phf_seed_t seed) {
	size_t n1 = PHF_MAX(n, 1); /* for computations that require n > 0 */
	size_t l1 = PHF_MAX(l, 1);
	size_t a1 = PHF_MAX(PHF_MIN(a, 100), 1);
	size_t r; /* number of buckets */
	size_t m; /* size of output array */
	phf_key<key_t> *B_k = NULL; /* linear bucket-slot array */
	size_t *B_z = NULL;         /* number of slots per bucket */
	phf_key<key_t> *B_p, *B_pe;
	phf_bits_t *T = NULL; /* bitmap to track index occupancy */
	phf_bits_t *T_b;      /* per-bucket working bitmap */
	size_t T_n;
	uint32_t *g = NULL; /* displacement map */
	uint32_t d_max = 0; /* maximum displacement value */
	int error;

	if ((phf->nodiv = nodiv)) {
		/* round to power-of-2 so we can use bit masks instead of modulo division */
		r = phf_powerup(n1 / PHF_MIN(l1, n1));
		m = phf_powerup((n1 * 100) / a1);
	} else {
		r = phf_primeup(PHF_HOWMANY(n1, l1));
		/* XXX: should we bother rounding m to prime number for small n? */
		m = phf_primeup((n1 * 100) / a1);
	}

	if (r == 0 || m == 0)
		return ERANGE;

	if (!(B_k = static_cast<phf_key<key_t> *>(calloc(n1, sizeof *B_k))))
		goto syerr;
	if (!(B_z = static_cast<size_t *>(calloc(r, sizeof *B_z))))
		goto syerr;

	for (size_t i = 0; i < n; i++) {
		phf_hash_t g = phf_g_mod_r<nodiv>(k[i], seed, r);

		B_k[i].k = k[i];
		B_k[i].g = g;
		B_k[i].n = &B_z[g];
		++*B_k[i].n;
	}

	qsort(B_k, n1, sizeof *B_k, reinterpret_cast<int(*)(const void *, const void *)>(&phf_keycmp<key_t>));

	T_n = PHF_HOWMANY(m, PHF_BITS(*T));
	if (!(T = static_cast<phf_bits_t *>(calloc(T_n * 2, sizeof *T))))
		goto syerr;
	T_b = &T[T_n]; /* share single allocation */

	/*
	 * FIXME: T_b[] is unnecessary. We could clear T[] the same way we
	 * clear T_b[]. In fact, at the end of generation T_b[] is identical
	 * to T[] because we don't clear T_b[] on success.
	 *
	 * We just need to tweak the current reset logic to stop before the
	 * key that failed, and then we can elide the commit to T[] at the
	 * end of the outer loop.
	 */

	if (!(g = static_cast<uint32_t *>(calloc(r, sizeof *g))))
		goto syerr;

	B_p = B_k;
	B_pe = &B_k[n];

	for (; B_p < B_pe && *B_p->n > 0; B_p += *B_p->n) {
		phf_key<key_t> *Bi_p, *Bi_pe;
		size_t d = 0;
		uint32_t f;
retry:
		d++;
		Bi_p = B_p;
		Bi_pe = B_p + *B_p->n;

		for (; Bi_p < Bi_pe; Bi_p++) {
			f = phf_f_mod_m<nodiv>(d, Bi_p->k, seed, m);

			if (phf_isset(T, f) || phf_isset(T_b, f)) {
				/* reset T_b[] */
				for (Bi_p = B_p; Bi_p < Bi_pe; Bi_p++) {
					f = phf_f_mod_m<nodiv>(d, Bi_p->k, seed, m);
					phf_clrbit(T_b, f);
				}

				goto retry;
			} else {
				phf_setbit(T_b, f);
			}
		}

		/* commit to T[] */
		for (Bi_p = B_p; Bi_p < Bi_pe; Bi_p++) {
			f = phf_f_mod_m<nodiv>(d, Bi_p->k, seed, m);
			phf_setbit(T, f);
		}

		/* commit to g[] */
		g[B_p->g] = d;
		d_max = PHF_MAX(d, d_max);
	}

	phf->seed = seed;
	phf->r = r;
	phf->m = m;

	phf->g = g;
	g = NULL;

	phf->d_max = d_max;
	phf->g_op = (nodiv)? phf::PHF_G_UINT32_BAND_R : phf::PHF_G_UINT32_MOD_R;
	phf->g_jmp = NULL;

	error = 0;

	goto clean;
syerr:
	error = errno;
clean:
	free(g);
	free(T);
	free(B_z);
	free(B_k);

	return error;
}